

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

bool __thiscall
google::protobuf::stringpiece_internal::StringPiece::ends_with(StringPiece *this,StringPiece x)

{
  int iVar1;
  ulong __n;
  
  __n = x.length_;
  if (this->length_ < __n) {
    return false;
  }
  iVar1 = bcmp(this->ptr_ + (this->length_ - __n),x.ptr_,__n);
  return iVar1 == 0;
}

Assistant:

bool ends_with(StringPiece x) const {
    return ((length_ >= x.length_) &&
            (memcmp(ptr_ + (length_-x.length_), x.ptr_,
                 static_cast<size_t>(x.length_)) == 0));
  }